

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic.c
# Opt level: O0

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double *in_RDX;
  long *in_RSI;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  sunrealtype u;
  sunrealtype lamda;
  sunrealtype *rdata;
  
  dVar1 = *in_RDX;
  dVar2 = **(double **)(*in_RDI + 0x10);
  dVar3 = atan(in_XMM0_Qa);
  **(double **)(*in_RSI + 0x10) =
       -dVar1 * dVar3 + dVar1 * dVar2 + 1.0 / (in_XMM0_Qa * in_XMM0_Qa + 1.0);
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype* rdata = (sunrealtype*)user_data; /* cast user_data to sunrealtype */
  sunrealtype lamda = rdata[0];       /* set shortcut for stiffness parameter */
  sunrealtype u     = NV_Ith_S(y, 0); /* access current solution value */

  /* fill in the RHS function: "NV_Ith_S" accesses the 0th entry of ydot */
  NV_Ith_S(ydot, 0) = lamda * u + SUN_RCONST(1.0) / (SUN_RCONST(1.0) + t * t) -
                      lamda * atan(t);

  return 0; /* return with success */
}